

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O1

sexp sexp_list_to_uvector_op(sexp ctx,sexp self,sexp_sint_t n,sexp etype,sexp ls)

{
  anon_union_24768_35_b8e82fc1_for_value *paVar1;
  byte *pbVar2;
  sexp b;
  double dVar3;
  undefined1 x [16];
  undefined1 x_00 [16];
  ulong uVar4;
  char cVar5;
  byte bVar6;
  uchar uVar7;
  unsigned_short uVar8;
  int iVar9;
  sexp psVar10;
  sexp psVar11;
  anon_union_24768_35_b8e82fc1_for_value *paVar12;
  uint uVar13;
  sexp_sint_t n_00;
  sexp_sint_t n_01;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  sexp_uint_t sVar14;
  long lVar15;
  ulong uVar16;
  sexp psVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  sexp res;
  sexp_gc_var_t __sexp_gc_preserver1;
  undefined8 in_stack_ffffffffffffff98;
  sexp_gc_var_t local_48;
  
  if (((ulong)etype & 1) == 0) {
    psVar10 = sexp_type_exception(ctx,self,2,etype);
    return psVar10;
  }
  local_48.var = (sexp_conflict *)0x0;
  local_48.next = (sexp_gc_var_t *)0x0;
  psVar10 = self;
  psVar11 = ctx;
  sexp_listp_op(ctx,self,n,ls);
  local_48.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_48;
  uVar20 = (long)etype >> 1;
  local_48.var = (sexp_conflict *)&stack0xffffffffffffffa0;
  psVar10 = sexp_length_op(psVar11,psVar10,n_00,ls);
  if (uVar20 == 3) {
    psVar11 = (sexp)0x0;
    psVar10 = sexp_make_bytes_op(ctx,(sexp)0x0,n_01,psVar10,(sexp)&DAT_0000043e);
    uVar19 = extraout_RDX;
  }
  else {
    psVar11 = (sexp)0x0;
    psVar10 = sexp_make_uvector_op(ctx,(sexp)0x0,n_01,etype,psVar10);
    uVar19 = extraout_RDX_00;
  }
  if ((0x154UL >> (uVar20 & 0x3f) & 1) == 0) {
    if ((0x1b00UL >> (uVar20 & 0x3f) & 1) == 0) {
      uVar18 = ~(-1L << (""[uVar20] & 0x3f));
    }
    else {
      uVar18 = 0xffffffffffffffff;
    }
    uVar16 = 0;
  }
  else {
    uVar16 = -1L << (""[uVar20] - 1 & 0x3f);
    uVar18 = ~uVar16;
  }
  if (((ulong)ls & 3) == 0) {
    psVar17 = ls;
    do {
      if (psVar17->tag != 6) break;
      b = (psVar17->value).type.name;
      if ((0x3feUL >> ((byte)uVar20 & 0x3f) & 1) != 0) {
        uVar19 = (uint)b & 3 | uVar16;
        sVar14 = (long)b >> 1;
        if ((uVar19 == 0) && (b->tag == 0xc)) {
          if ('\0' < (b->value).flonum_bits[0]) {
LAB_00116026:
            uVar19 = sVar14;
            if (((ulong)b & 1) == 0) {
              if ((((ulong)b & 2) == 0) && (b->tag == 0xc)) {
                uVar19 = (long)(b->value).flonum_bits[0] * (b->value).uvector.length;
              }
              else {
                uVar19 = 0;
              }
            }
            if (-1 < (long)uVar19) {
              if (((ulong)b & 1) == 0) {
                if ((((ulong)b & 2) == 0) && (b->tag == 0xc)) {
                  sVar14 = (b->value).string.length;
                }
                else {
                  sVar14 = 0;
                }
              }
              uVar19 = sVar14;
              if (uVar18 < sVar14) goto LAB_00116083;
            }
            goto LAB_00116074;
          }
        }
        else {
          uVar4 = sVar14;
          if (((ulong)b & 1) == 0) {
            if ((((ulong)b & 2) != 0) || (b->tag != 0xc)) goto LAB_00116083;
            uVar4 = (long)(b->value).flonum_bits[0] * (b->value).uvector.length;
          }
          uVar19 = uVar4;
          if ((long)uVar16 <= (long)uVar19) goto LAB_00116026;
        }
LAB_00116083:
        psVar10 = sexp_cons_op(ctx,psVar11,uVar19,(sexp)&DAT_0000003e,(sexp)&DAT_0000003e);
        x._8_8_ = psVar10;
        x._0_8_ = in_stack_ffffffffffffff98;
        psVar11 = sexp_make_integer(ctx,(sexp_lsint_t)x);
        (psVar10->value).type.name = psVar11;
        x_00._8_8_ = psVar10;
        x_00._0_8_ = in_stack_ffffffffffffff98;
        psVar11 = sexp_make_integer(ctx,(sexp_lsint_t)x_00);
        (psVar10->value).type.cpl = psVar11;
        psVar10 = sexp_list2(ctx,psVar10,b);
        psVar10 = sexp_xtype_exception(ctx,self,"invalid uniform vector value",psVar10);
        break;
      }
      if (((ulong)etype & 0xfffffffffffffffc) == 0x18) {
        if ((((ulong)b & 1) == 0) &&
           ((((ulong)b & 2) != 0 || (uVar13 = b->tag - 0xb, uVar19 = (ulong)uVar13, 3 < uVar13))))
        goto LAB_00116083;
      }
      else if ((((ulong)b & 1) == 0) &&
              ((((ulong)b & 2) != 0 || (uVar13 = b->tag - 0xb, uVar19 = (ulong)uVar13, 2 < uVar13)))
              ) goto LAB_00116083;
LAB_00116074:
      psVar17 = (psVar17->value).type.cpl;
    } while (((ulong)psVar17 & 3) == 0);
  }
  if (((ulong)psVar10 & 3) == 0) {
    if (psVar10->tag == 0x13 || ((ulong)ls & 3) != 0) goto LAB_00116444;
  }
  else if (((ulong)ls & 3) != 0) goto LAB_00116444;
  lVar15 = 0;
  uVar19 = 0;
  do {
    if (ls->tag != 6) break;
    switch(uVar20) {
    case 1:
      bVar6 = '\x01' << ((byte)uVar19 & 7);
      if ((ls->value).type.name < (sexp)0x2) {
        pbVar2 = (byte *)((((psVar10->value).type.name)->value).flonum_bits + (uVar19 >> 3) + 8);
        *pbVar2 = *pbVar2 & ~bVar6;
      }
      else {
        pbVar2 = (byte *)((((psVar10->value).type.name)->value).flonum_bits + (uVar19 >> 3) + 8);
        *pbVar2 = *pbVar2 | bVar6;
      }
      break;
    case 2:
      cVar5 = (char)(*(uint *)&ls->value >> 1);
      psVar11 = (psVar10->value).type.name;
      goto LAB_00116255;
    case 3:
      cVar5 = (char)(*(uint *)&ls->value >> 1);
      psVar11 = psVar10;
LAB_00116255:
      (psVar11->value).flonum_bits[uVar19 + 8] = cVar5;
      break;
    case 4:
    case 5:
      *(short *)((long)&((psVar10->value).type.name)->value + uVar19 * 2 + 8) =
           (short)(*(uint *)&ls->value >> 1);
      break;
    case 6:
      psVar11 = (ls->value).type.name;
      if (((ulong)psVar11 & 1) == 0) {
        if ((((ulong)psVar11 & 2) == 0) && (psVar11->tag == 0xc)) {
          iVar9 = (int)(psVar11->value).flonum_bits[0] * (int)(psVar11->value).uvector.length;
        }
        else {
LAB_0011634b:
          iVar9 = 0;
        }
      }
      else {
LAB_001162f4:
        iVar9 = (int)((long)psVar11 >> 1);
      }
      goto LAB_0011634d;
    case 7:
      psVar11 = (ls->value).type.name;
      if (((ulong)psVar11 & 1) != 0) goto LAB_001162f4;
      if ((((ulong)psVar11 & 2) != 0) || (psVar11->tag != 0xc)) goto LAB_0011634b;
      iVar9 = (int)(psVar11->value).uvector.length;
LAB_0011634d:
      *(int *)((long)&((psVar10->value).type.name)->value + uVar19 * 4 + 8) = iVar9;
      break;
    case 8:
      psVar11 = (ls->value).type.name;
      if (((ulong)psVar11 & 1) == 0) {
        if ((((ulong)psVar11 & 2) == 0) && (psVar11->tag == 0xc)) {
          psVar11 = (sexp)((long)(psVar11->value).flonum_bits[0] * (psVar11->value).uvector.length);
        }
        else {
LAB_00116336:
          psVar11 = (sexp)0x0;
        }
      }
      else {
LAB_00116331:
        psVar11 = (sexp)((long)psVar11 >> 1);
      }
      goto LAB_00116338;
    case 9:
      psVar11 = (ls->value).type.name;
      if (((ulong)psVar11 & 1) != 0) goto LAB_00116331;
      if ((((ulong)psVar11 & 2) != 0) || (psVar11->tag != 0xc)) goto LAB_00116336;
      psVar11 = (psVar11->value).type.slots;
LAB_00116338:
      *(sexp *)((long)&((psVar10->value).type.name)->value + uVar19 * 8 + 8) = psVar11;
      break;
    case 10:
      dVar3 = sexp_to_double(ctx,(ls->value).type.name);
      *(float *)((long)&((psVar10->value).type.name)->value + uVar19 * 4 + 8) = (float)dVar3;
      break;
    case 0xb:
      dVar3 = sexp_to_double(ctx,(ls->value).type.name);
      *(double *)((long)&((psVar10->value).type.name)->value + uVar19 * 8 + 8) = dVar3;
      break;
    case 0xc:
      paVar1 = &ls->value;
      psVar11 = (ls->value).type.name;
      paVar12 = paVar1;
      if ((((ulong)psVar11 & 3) == 0) && (psVar11->tag == 0xe)) {
        paVar12 = &psVar11->value;
      }
      dVar3 = sexp_to_double(ctx,(paVar12->type).name);
      *(float *)((long)&((psVar10->value).type.name)->value + uVar19 * 8 + 8) = (float)dVar3;
      psVar11 = (paVar1->type).name;
      psVar17 = (sexp)&DAT_00000001;
      if ((((ulong)psVar11 & 3) == 0) && (psVar11->tag == 0xe)) {
        psVar17 = (psVar11->value).type.cpl;
      }
      dVar3 = sexp_to_double(ctx,psVar17);
      *(float *)((long)&((psVar10->value).type.name)->value + uVar19 * 8 + 0xc) = (float)dVar3;
      break;
    case 0xd:
      paVar1 = &ls->value;
      psVar11 = (ls->value).type.name;
      paVar12 = paVar1;
      if ((((ulong)psVar11 & 3) == 0) && (psVar11->tag == 0xe)) {
        paVar12 = &psVar11->value;
      }
      dVar3 = sexp_to_double(ctx,(paVar12->type).name);
      *(double *)((long)&((psVar10->value).type.name)->value + lVar15 + 8) = dVar3;
      psVar11 = (paVar1->type).name;
      psVar17 = (sexp)&DAT_00000001;
      if ((((ulong)psVar11 & 3) == 0) && (psVar11->tag == 0xe)) {
        psVar17 = (psVar11->value).type.cpl;
      }
      dVar3 = sexp_to_double(ctx,psVar17);
      *(double *)((long)&((psVar10->value).type.name)->value + lVar15 + 0x10) = dVar3;
      break;
    case 0xe:
      dVar3 = sexp_to_double(ctx,(ls->value).type.name);
      uVar7 = sexp_double_to_quarter(dVar3);
      (((psVar10->value).type.name)->value).flonum_bits[uVar19 + 8] = uVar7;
      break;
    case 0xf:
      dVar3 = sexp_to_double(ctx,(ls->value).type.name);
      uVar8 = sexp_double_to_half(dVar3);
      *(unsigned_short *)((long)&((psVar10->value).type.name)->value + uVar19 * 2 + 8) = uVar8;
    }
    ls = (ls->value).type.cpl;
    uVar19 = uVar19 + 1;
    lVar15 = lVar15 + 0x10;
  } while (((ulong)ls & 3) == 0);
LAB_00116444:
  (ctx->value).context.saves = local_48.next;
  return psVar10;
}

Assistant:

sexp sexp_list_to_uvector_op(sexp ctx, sexp self, sexp_sint_t n, sexp etype, sexp ls) {
  long et, i;
  long long min;
  unsigned long long max;
  sexp ls2, tmp;
  sexp_assert_type(ctx, sexp_fixnump, SEXP_FIXNUM, etype);
  sexp_gc_var1(res);
  if (!sexp_listp(ctx, ls)) {
    res = sexp_exceptionp(ls) ? ls
      : sexp_xtype_exception(ctx, self, "list->uvector expected a list", ls);
  } else {
    sexp_gc_preserve1(ctx, res);
    et = sexp_unbox_fixnum(etype);
    res = et == SEXP_U8 ? sexp_make_bytes(ctx, sexp_length(ctx, ls), SEXP_VOID) : sexp_make_uvector(ctx, etype, sexp_length(ctx, ls));
    if (sexp_uvector_prefix(et) == 's') {
      min = (-1LL << (sexp_uvector_element_size(et)-1));
      max = (1LL << (sexp_uvector_element_size(et)-1)) - 1LL;
    } else {
      min = 0;
      max = sexp_uvector_element_size(et) == 64 ? -1 :
        (1uLL << sexp_uvector_element_size(et)) - 1LL;
    }
    for (ls2=ls; sexp_pairp(ls2); ls2=sexp_cdr(ls2)) {
      tmp = sexp_car(ls2);
      if (
#if SEXP_USE_UNIFORM_VECTOR_LITERALS
          ((sexp_uvector_prefix(et) == 'u') || (sexp_uvector_prefix(et) == 's')) ?
#endif
          !((min == 0 && sexp_bignump(tmp) ? sexp_bignum_sign(tmp) > 0 : sexp_exact_integerp(tmp) && sexp_sint_value(tmp) >= min)
            && (sexp_sint_value(tmp) < 0 || sexp_uint_value(tmp) <= max))
#if SEXP_USE_UNIFORM_VECTOR_LITERALS
          : ((sexp_uvector_prefix(et) == 'c') ? !sexp_numberp(tmp) :
          !(sexp_exact_integerp(tmp) || sexp_realp(tmp)))
#endif
          ) {
        res = sexp_cons(ctx, SEXP_FALSE, SEXP_FALSE);
        sexp_car(res) = sexp_make_integer(ctx, min);
        sexp_cdr(res) = sexp_make_integer(ctx, max);
        res = sexp_list2(ctx, res, tmp);
        res = sexp_xtype_exception(ctx, self, "invalid uniform vector value", res);
        break;
      }
    }
    if (!sexp_exceptionp(res)) {
      for (i=0; sexp_pairp(ls); ls=sexp_cdr(ls), i++) {
#if SEXP_USE_UNIFORM_VECTOR_LITERALS
        switch (et) {
        case SEXP_U1:
          sexp_bit_set(res, i, sexp_unbox_fixnum(sexp_car(ls))); break;
        case SEXP_S8:
          ((signed char*)sexp_uvector_data(res))[i] = sexp_unbox_fixnum(sexp_car(ls)); break;
        case SEXP_U8:
#endif
          sexp_bytes_set(res, sexp_make_fixnum(i), sexp_car(ls));
#if SEXP_USE_UNIFORM_VECTOR_LITERALS
          break;
        case SEXP_S16:
          ((signed short*)sexp_uvector_data(res))[i] = sexp_unbox_fixnum(sexp_car(ls)); break;
        case SEXP_U16:
          ((unsigned short*)sexp_uvector_data(res))[i] = sexp_unbox_fixnum(sexp_car(ls)); break;
        case SEXP_S32:
          ((int32_t*)sexp_uvector_data(res))[i] = sexp_sint_value(sexp_car(ls)); break;
        case SEXP_U32:
          ((uint32_t*)sexp_uvector_data(res))[i] = sexp_uint_value(sexp_car(ls)); break;
        case SEXP_S64:
          ((int64_t*)sexp_uvector_data(res))[i] = sexp_sint_value(sexp_car(ls)); break;
        case SEXP_U64:
          ((uint64_t*)sexp_uvector_data(res))[i] = sexp_uint_value(sexp_car(ls)); break;
#if SEXP_USE_FLONUMS
#if SEXP_USE_MINI_FLOAT_UNIFORM_VECTORS
        case SEXP_F8:
          ((unsigned char*)sexp_uvector_data(res))[i] = sexp_double_to_quarter(sexp_to_double(ctx, sexp_car(ls))); break;
        case SEXP_F16:
          ((unsigned short*)sexp_uvector_data(res))[i] = sexp_double_to_half(sexp_to_double(ctx, sexp_car(ls))); break;
#endif
        case SEXP_F32:
          ((float*)sexp_uvector_data(res))[i] = sexp_to_double(ctx, sexp_car(ls)); break;
        case SEXP_F64:
          ((double*)sexp_uvector_data(res))[i] = sexp_to_double(ctx, sexp_car(ls)); break;
#endif
#if SEXP_USE_COMPLEX
        case SEXP_C64:
          ((float*)sexp_uvector_data(res))[i*2] =
            sexp_to_double(ctx, sexp_real_part(sexp_car(ls)));
          ((float*)sexp_uvector_data(res))[i*2 + 1] =
            sexp_to_double(ctx, sexp_imag_part(sexp_car(ls)));
          break;
        case SEXP_C128:
          ((double*)sexp_uvector_data(res))[i*2] =
            sexp_to_double(ctx, sexp_real_part(sexp_car(ls)));
          ((double*)sexp_uvector_data(res))[i*2 + 1] =
            sexp_to_double(ctx, sexp_imag_part(sexp_car(ls)));
          break;
#endif
        }
#endif  /* SEXP_USE_UNIFORM_VECTOR_LITERALS */
      }
    }
    sexp_gc_release1(ctx);
  }
  return res;
}